

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O3

int Abc_FrameSetMode(Abc_Frame_t *p,int fNameMode)

{
  int iVar1;
  char Buffer [2];
  char local_1a [2];
  
  iVar1 = Abc_FrameReadMode(p);
  local_1a[0] = (char)fNameMode + '0';
  local_1a[1] = 0;
  Cmd_FlagUpdateValue(p,"namemode",local_1a);
  return iVar1;
}

Assistant:

int Abc_FrameSetMode( Abc_Frame_t * p, int fNameMode )
{
    char Buffer[2];
    int fNameModeOld;
    fNameModeOld = Abc_FrameReadMode( p );
    Buffer[0] = '0' + fNameMode;
    Buffer[1] = 0;
    Cmd_FlagUpdateValue( p, "namemode", (char *)Buffer );
    return fNameModeOld;
}